

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O0

csafestring_t * json2map_concatPaths(char *parent,char *key,int arrayIdx)

{
  csafestring_t *str;
  uint in_EDX;
  csafestring_t *in_RSI;
  char *in_RDI;
  csafestring_t *buffer;
  char arrayIdxBuff [10];
  csafestring_t *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  str = safe_create((char *)in_stack_ffffffffffffffe0);
  if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
    safe_strcpy(in_stack_ffffffffffffffe0,(char *)str);
  }
  else {
    safe_strcpy(in_stack_ffffffffffffffe0,(char *)str);
    safe_strchrappend(in_stack_ffffffffffffffe0,(char)((ulong)str >> 0x38));
    safe_strcat(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  if (-1 < (int)in_EDX) {
    sprintf(&stack0xffffffffffffffe2,"%c%d%c",0x5b,(ulong)in_EDX,0x5d);
    safe_strcat(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  if (in_EDX == 0xfffffffe) {
    sprintf(&stack0xffffffffffffffe2,"%c%c%c",0x5b,0x78,0x5d);
    safe_strcat(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  return str;
}

Assistant:

static csafestring_t *json2map_concatPaths(char *parent, char *key, int arrayIdx) {
	DEBUG_TEXT("json2map_concatPaths(%s, %s, %d)...", parent, key, arrayIdx);

	char arrayIdxBuff[10];
	csafestring_t *buffer = safe_create(NULL);

	if ( parent != NULL && *parent != '\0' ) {
		safe_strcpy(buffer, parent);
		safe_strchrappend(buffer, JSON2MAP_MAP_OBJECT_SEPARATOR);
		safe_strcat(buffer, key);
	} else {
		safe_strcpy(buffer, key);
	}

	if ( arrayIdx >= 0 ) {
		sprintf(arrayIdxBuff, "%c%d%c", JSON2MAP_MAP_ARRAY_START, arrayIdx, JSON2MAP_MAP_ARRAY_END);
		safe_strcat(buffer, arrayIdxBuff);
	}
	if ( arrayIdx == -2 ) {
		sprintf(arrayIdxBuff, "%c%c%c", JSON2MAP_MAP_ARRAY_START, JSON2MAP_MAP_ARRAY_COUNT, JSON2MAP_MAP_ARRAY_END);
		safe_strcat(buffer, arrayIdxBuff);
	}

	DEBUG_TEXT("json2map_concatPaths(%s, %s, %d)... DONE", parent, key, arrayIdx);
	return buffer;
}